

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

int quote_fname(char *file)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 local_280;
  char *lfn_cp;
  char ver_buf [16];
  size_t len;
  char *pcStack_250;
  int ver_no;
  char *lf_cp;
  char *end;
  char *start;
  char ver [16];
  char namebuf [256];
  char fbuf [256];
  char *pcStack_20;
  int extensionp;
  char *dp;
  char *cp;
  char *file_local;
  
  pcStack_20 = namebuf + 0xf8;
  for (dp = file; *dp != '\0'; dp = dp + 1) {
    cVar1 = *dp;
    if (((cVar1 == '\'') || (cVar1 == ';')) || (cVar1 == '>')) {
      *pcStack_20 = '\'';
      pcStack_20[1] = *dp;
      pcStack_20 = pcStack_20 + 2;
    }
    else {
      *pcStack_20 = *dp;
      pcStack_20 = pcStack_20 + 1;
    }
  }
  *pcStack_20 = '\0';
  separate_version(namebuf + 0xf8,(char *)&start,1);
  dp = namebuf + 0xf8;
  bVar4 = false;
  while( true ) {
    bVar3 = false;
    if (*dp != '\0') {
      bVar3 = (bool)(bVar4 ^ 1);
    }
    if (!bVar3) break;
    if (*dp == '\'') {
      if (dp[1] == '\0') {
        dp = dp + 1;
      }
      else {
        dp = dp + 2;
      }
    }
    else if (*dp == '.') {
      if (dp[1] != '\0') {
        bVar4 = true;
      }
      dp = dp + 1;
    }
    else {
      dp = dp + 1;
    }
  }
  if (!bVar4) {
    if (dp[-1] == '.') {
      dp[-1] = '\'';
      *dp = '.';
      dp = dp + 1;
    }
    *dp = '.';
    dp[1] = '\0';
  }
  if ((char)start == '\0') {
    strcpy(ver + 8,namebuf + 0xf8);
  }
  else if ((char)start == '\0') {
    strcpy(ver + 8,namebuf + 0xf8);
  }
  else {
    strcpy(ver + 8,namebuf + 0xf8);
    strcat(ver + 8,".~");
    strcat(ver + 8,(char *)&start);
    strcat(ver + 8,"~");
  }
  lf_cp = strchr(ver + 8,0x7e);
  end = lf_cp;
  pcVar2 = lf_cp;
  if (lf_cp != (char *)0x0) {
    while (pcStack_250 = pcVar2 + 1, *pcStack_250 != '\0') {
      pcVar2 = pcStack_250;
      if (*pcStack_250 == '~') {
        end = lf_cp;
        lf_cp = pcStack_250;
      }
    }
    if (((end != lf_cp) && (end[-1] == '.')) && (lf_cp == pcVar2)) {
      strncpy((char *)&lfn_cp,end + 1,(size_t)(lf_cp + (-1 - (long)end)));
      *(char *)((long)&local_280 + (long)(lf_cp + (-1 - (long)end) + 8)) = '\0';
      if ((char)lfn_cp != '\0') {
        for (local_280 = &lfn_cp; *(char *)local_280 != '\0';
            local_280 = (char **)((long)local_280 + 1)) {
          if ((*(char *)local_280 < '0') || ('9' < *(char *)local_280)) goto LAB_0015f4b4;
        }
        end[-1] = ';';
        *end = '\0';
        *lf_cp = '\0';
        uVar5 = strtoul(end + 1,(char **)0x0,10);
        sprintf((char *)&lfn_cp,"%u",uVar5 & 0xffffffff);
        strcat(ver + 8,(char *)&lfn_cp);
      }
    }
  }
LAB_0015f4b4:
  strcpy(file,ver + 8);
  return 1;
}

Assistant:

int quote_fname(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1], namebuf[MAXNAMLEN + 1], ver[VERSIONLEN];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  separate_version(fbuf, ver, 1);
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  if (*ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }
  UnixVersionToLispVersion(namebuf, 1);
  strcpy(file, namebuf);
  return (1);
}